

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall
Lowerer::LowerUpdateNewScObjectCache
          (Lowerer *this,Instr *insertInstr,Opnd *dst,Opnd *src1,bool isCtorFunction)

{
  LowererMD *this_00;
  Func *func;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  byte bVar4;
  uint32 offset;
  LabelInstr *target;
  RegOpnd *baseOpnd;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  IndirOpnd *pIVar7;
  IntConstOpnd *compareSrc2;
  BranchInstr *branchInstr;
  RegOpnd *dst_00;
  LabelInstr *instr;
  HelperCallOpnd *this_01;
  Instr *instr_00;
  Lowerer *pLVar8;
  undefined7 in_register_00000081;
  
  pLVar8 = (Lowerer *)0x176;
  target = IR::LabelInstr::New(Label,this->m_func,false);
  baseOpnd = GetRegOpnd(pLVar8,src1,insertInstr,this->m_func,TyInt64);
  if ((int)CONCAT71(in_register_00000081,isCtorFunction) == 0) {
    OVar2 = IR::Opnd::GetKind(&baseOpnd->super_Opnd);
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_0059e9a8;
      *puVar5 = 0;
    }
    pRVar6 = IR::RegOpnd::New(TyInt64,this->m_func);
    pIVar7 = IR::IndirOpnd::New(baseOpnd,8,TyInt64,this->m_func,false);
    InsertMove(&pRVar6->super_Opnd,&pIVar7->super_Opnd,insertInstr,true);
    offset = Js::Type::GetOffsetOfTypeId();
    pIVar7 = IR::IndirOpnd::New(pRVar6,offset,TyInt32,this->m_func,false);
    pLVar8 = (Lowerer *)0x1b;
    compareSrc2 = IR::IntConstOpnd::New(0x1b,TyInt32,this->m_func,true);
    branchInstr = InsertCompareBranch(pLVar8,&pIVar7->super_Opnd,&compareSrc2->super_Opnd,BrNeq_A,
                                      false,target,insertInstr,false);
    LowererMD::InsertObjectPoison(&baseOpnd->super_Opnd,branchInstr,insertInstr,false);
  }
  pRVar6 = IR::RegOpnd::New(TyVar,this->m_func);
  OVar2 = IR::Opnd::GetKind(&baseOpnd->super_Opnd);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_0059e9a8;
    *puVar5 = 0;
  }
  pIVar7 = IR::IndirOpnd::New(baseOpnd,0x20,TyInt64,this->m_func,false);
  InsertMove(&pRVar6->super_Opnd,&pIVar7->super_Opnd,insertInstr,true);
  dst_00 = IR::RegOpnd::New(TyInt8,this->m_func);
  pIVar7 = IR::IndirOpnd::New(pRVar6,0x26,TyUint8,this->m_func,false);
  InsertMove(&dst_00->super_Opnd,&pIVar7->super_Opnd,insertInstr,true);
  InsertTest(&dst_00->super_Opnd,&dst_00->super_Opnd,insertInstr);
  InsertBranch(BrEq_A,false,target,insertInstr);
  instr = IR::LabelInstr::New(Label,this->m_func,true);
  IR::Instr::InsertBefore(insertInstr,&instr->super_Instr);
  this_01 = IR::HelperCallOpnd::New(HelperUpdateNewScObjectCache,this->m_func);
  LoadScriptContext(this,insertInstr);
  this_00 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_00,insertInstr,dst);
  LowererMD::LoadHelperArgument(this_00,insertInstr,&baseOpnd->super_Opnd);
  instr_00 = IR::Instr::New(Call,this->m_func);
  if (instr_00->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_0059e9a8;
    *puVar5 = 0;
  }
  func = instr_00->m_func;
  if ((this_01->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_0059e9a8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar4 = (this_01->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    this_01 = (HelperCallOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,func);
    bVar4 = (this_01->super_Opnd).field_0xb;
  }
  (this_01->super_Opnd).field_0xb = bVar4 | 2;
  instr_00->m_src1 = &this_01->super_Opnd;
  IR::Instr::InsertBefore(insertInstr,instr_00);
  LowererMD::LowerCall(this_00,instr_00,0);
  IR::Instr::InsertBefore(insertInstr,&target->super_Instr);
  return insertInstr;
}

Assistant:

IR::Instr *
Lowerer::LowerUpdateNewScObjectCache(IR::Instr * insertInstr, IR::Opnd *dst, IR::Opnd *src1, const bool isCtorFunction)
{
    // if (!isCtorFunction)
    // {
    //     MOV r1, [src1 + offset(type)]       -- check base TypeIds_Function
    //     CMP [r1 + offset(typeId)], TypeIds_Function
    // }
    // JNE $fallThru
    // MOV r2, [src1 + offset(constructorCache)]
    // MOV r3, [r2 + offset(updateAfterCtor)]
    // TEST r3, r3                         -- check if updateAfterCtor is 0
    // JEQ $fallThru
    // CALL UpdateNewScObjectCache(src1, dst, scriptContext)
    // $fallThru:
    IR::LabelInstr *labelFallThru = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    src1 = GetRegOpnd(src1, insertInstr, m_func, TyMachReg);

    // Check if constructor is a function if we don't already know it.
    if (!isCtorFunction)
    {
        IR::RegOpnd* src1RegOpnd = src1->AsRegOpnd();
        //  MOV r1, [src1 + offset(type)]       -- check base TypeIds_Function
        IR::RegOpnd *r1 = IR::RegOpnd::New(TyMachReg, this->m_func);
        IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(src1RegOpnd, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func);
        Lowerer::InsertMove(r1, indirOpnd, insertInstr);

        // CMP [r1 + offset(typeId)], TypeIds_Function
        // JNE $fallThru
        indirOpnd = IR::IndirOpnd::New(r1, Js::Type::GetOffsetOfTypeId(), TyInt32, this->m_func);
        IR::IntConstOpnd *intOpnd = IR::IntConstOpnd::New(Js::TypeIds_Function, TyInt32, this->m_func, true);
        IR::BranchInstr* branchInstr = InsertCompareBranch(indirOpnd, intOpnd, Js::OpCode::BrNeq_A, labelFallThru, insertInstr);
        InsertObjectPoison(src1RegOpnd, branchInstr, insertInstr, false);
    }

    // Every function has a constructor cache, even if only the default blank one.
    // r2 = MOV JavascriptFunction->constructorCache
    IR::RegOpnd *r2 = IR::RegOpnd::New(TyVar, this->m_func);
    IR::IndirOpnd *opndIndir = IR::IndirOpnd::New(src1->AsRegOpnd(), Js::JavascriptFunction::GetOffsetOfConstructorCache(), TyMachReg, this->m_func);
    IR::Instr *instr = Lowerer::InsertMove(r2, opndIndir, insertInstr);

    // r3 = constructorCache->updateAfterCtor
    IR::RegOpnd *r3 = IR::RegOpnd::New(TyInt8, this->m_func);
    IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(r2, Js::ConstructorCache::GetOffsetOfUpdateAfterCtor(), TyUint8, this->m_func);
    instr = Lowerer::InsertMove(r3, indirOpnd, insertInstr);

    // TEST r3, r3                         -- check if updateAfterCtor is 0
    // JEQ $fallThru
    InsertTestBranch(r3, r3, Js::OpCode::BrEq_A, labelFallThru, insertInstr);

    // r2 = UpdateNewScObjectCache(src1, dst, scriptContext)
    insertInstr->InsertBefore(IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true)); // helper label for uncommon path
    IR::HelperCallOpnd * opndHelper = IR::HelperCallOpnd::New(IR::HelperUpdateNewScObjectCache, m_func);

    LoadScriptContext(insertInstr);
    m_lowererMD.LoadHelperArgument(insertInstr, dst);
    m_lowererMD.LoadHelperArgument(insertInstr, src1);

    instr = IR::Instr::New(Js::OpCode::Call, m_func);
    instr->SetSrc1(opndHelper);
    insertInstr->InsertBefore(instr);
    m_lowererMD.LowerCall(instr, 0);

    // $fallThru:
    insertInstr->InsertBefore(labelFallThru);

    return insertInstr;
}